

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QString * __thiscall
QFileSystemModelPrivate::filePath(QFileSystemModelPrivate *this,QModelIndex *index)

{
  bool bVar1;
  bool bVar2;
  QFileSystemNode *pQVar3;
  qsizetype qVar4;
  undefined8 *in_RDX;
  QFileSystemModelPrivate *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *dirNode;
  QFileSystemModel *q;
  QString *fullPath;
  QModelIndex idx;
  QStringList path;
  QString *in_stack_ffffffffffffff18;
  QModelIndex *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  QModelIndex *pQVar5;
  undefined1 local_88 [28];
  QChar local_6c;
  QChar local_6a [13];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  q_func(in_RSI);
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff20);
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0xaa2a83);
    local_38 = *in_RDX;
    local_30 = in_RDX[1];
    local_28 = in_RDX[2];
    while (bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff20), bVar1) {
      pQVar3 = node((QFileSystemModelPrivate *)
                    CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                    in_stack_ffffffffffffff20);
      if (pQVar3 != (QFileSystemNode *)0x0) {
        QList<QString>::prepend
                  ((QList<QString> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      QModelIndex::parent(in_RDI);
      local_38 = local_50;
      local_30 = local_48;
      local_28 = local_40;
    }
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QDir::separator();
    QListSpecialMethods<QString>::join
              ((QListSpecialMethods<QString> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               (QChar)(char16_t)((ulong)pQVar5 >> 0x30));
    QDir::fromNativeSeparators((QString *)in_RDI);
    QString::~QString((QString *)0xaa2bd3);
    qVar4 = QString::size((QString *)in_RDI);
    bVar1 = false;
    if (2 < qVar4) {
      in_stack_ffffffffffffff20 =
           (QModelIndex *)QString::operator[](in_stack_ffffffffffffff18,0xaa2bfa);
      QChar::QChar<char16_t,_true>(local_6a,L'/');
      bVar2 = ::operator==((QChar *)in_stack_ffffffffffffff20,(QChar *)in_stack_ffffffffffffff18);
      bVar1 = false;
      if (bVar2) {
        in_stack_ffffffffffffff18 =
             (QString *)QString::operator[](in_stack_ffffffffffffff18,0xaa2c3b);
        QChar::QChar<char16_t,_true>(&local_6c,L'/');
        bVar1 = ::operator==((QChar *)in_stack_ffffffffffffff20,(QChar *)in_stack_ffffffffffffff18);
      }
    }
    if (bVar1 != false) {
      QString::mid((longlong)local_88,(longlong)in_RDI);
      QString::operator=((QString *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      QString::~QString((QString *)0xaa2c9e);
    }
    QList<QString>::~QList((QList<QString> *)0xaa2cc1);
  }
  else {
    QString::QString((QString *)0xaa2a44);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModelPrivate::filePath(const QModelIndex &index) const
{
    Q_Q(const QFileSystemModel);
    Q_UNUSED(q);
    if (!index.isValid())
        return QString();
    Q_ASSERT(index.model() == q);

    QStringList path;
    QModelIndex idx = index;
    while (idx.isValid()) {
        QFileSystemModelPrivate::QFileSystemNode *dirNode = node(idx);
        if (dirNode)
            path.prepend(dirNode->fileName);
        idx = idx.parent();
    }
    QString fullPath = QDir::fromNativeSeparators(path.join(QDir::separator()));
#if !defined(Q_OS_WIN)
    if ((fullPath.size() > 2) && fullPath[0] == u'/' && fullPath[1] == u'/')
        fullPath = fullPath.mid(1);
#else
    if (fullPath.length() == 2 && fullPath.endsWith(u':'))
        fullPath.append(u'/');
#endif
    return fullPath;
}